

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deps_log.cc
# Opt level: O2

bool __thiscall DepsLog::OpenForWriteIfNeeded(DepsLog *this)

{
  int iVar1;
  FILE *__stream;
  long lVar2;
  size_t sVar3;
  
  if ((this->file_path_)._M_string_length == 0) {
    return true;
  }
  __stream = fopen((this->file_path_)._M_dataplus._M_p,"ab");
  this->file_ = (FILE *)__stream;
  if (__stream != (FILE *)0x0) {
    iVar1 = setvbuf(__stream,(char *)0x0,0,0x80000);
    if (iVar1 != 0) {
      return false;
    }
    iVar1 = fileno((FILE *)this->file_);
    SetCloseOnExec(iVar1);
    fseek((FILE *)this->file_,0,2);
    lVar2 = ftell((FILE *)this->file_);
    if (((lVar2 != 0) ||
        ((sVar3 = fwrite("# ninjadeps\n",0xc,1,(FILE *)this->file_), sVar3 != 0 &&
         (sVar3 = fwrite(&kCurrentVersion,4,1,(FILE *)this->file_), sVar3 != 0)))) &&
       (iVar1 = fflush((FILE *)this->file_), iVar1 == 0)) {
      (this->file_path_)._M_string_length = 0;
      *(this->file_path_)._M_dataplus._M_p = '\0';
      return true;
    }
  }
  return false;
}

Assistant:

bool DepsLog::OpenForWriteIfNeeded() {
  if (file_path_.empty()) {
    return true;
  }
  file_ = fopen(file_path_.c_str(), "ab");
  if (!file_) {
    return false;
  }
  // Set the buffer size to this and flush the file buffer after every record
  // to make sure records aren't written partially.
  if (setvbuf(file_, NULL, _IOFBF, kMaxRecordSize + 1) != 0) {
    return false;
  }
  SetCloseOnExec(fileno(file_));

  // Opening a file in append mode doesn't set the file pointer to the file's
  // end on Windows. Do that explicitly.
  fseek(file_, 0, SEEK_END);

  if (ftell(file_) == 0) {
    if (fwrite(kFileSignature, sizeof(kFileSignature) - 1, 1, file_) < 1) {
      return false;
    }
    if (fwrite(&kCurrentVersion, 4, 1, file_) < 1) {
      return false;
    }
  }
  if (fflush(file_) != 0) {
    return false;
  }
  file_path_.clear();
  return true;
}